

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

bool __thiscall TPZFMatrix<double>::Compare(TPZFMatrix<double> *this,TPZSavable *copy,bool override)

{
  bool bVar1;
  TPZFMatrix<double> *A;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  stringstream sout;
  double local_1e0;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (copy != (TPZSavable *)0x0) {
    A = (TPZFMatrix<double> *)__dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (A == (TPZFMatrix<double> *)0x0) {
      return false;
    }
    bVar1 = TPZMatrix<double>::Compare(&this->super_TPZMatrix<double>,copy,false);
    lVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    local_1e0 = 0.0;
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      bVar1 = (bool)(bVar1 & this->fElem[lVar4] == A->fElem[lVar4]);
      local_1e0 = local_1e0 + ABS(this->fElem[lVar4] - A->fElem[lVar4]);
    }
    if (bVar1 != false) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar2 = std::operator<<(local_1a8,
                             "virtual bool TPZFMatrix<double>::Compare(TPZSavable *, bool) [TVar = double]"
                            );
    std::operator<<(poVar2," did not compare ");
    poVar2 = std::operator<<(local_1a8," number different terms ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," number terms ");
    std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(local_1a8," difference in norm L1 ");
    std::ostream::_M_insert<double>(local_1e0);
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<((ostream *)&std::cout,local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    if (override) {
      operator=(this,A);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        this->operator=(*fmat);
    }
    return matresult;
}